

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

v6 * fmt::v6::detail::vformat<char>
               (basic_string_view<char> format_str,
               basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
               args)

{
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_2
  in_R8;
  allocator<char> local_249;
  undefined1 local_248 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  args_local;
  basic_string_view<char> format_str_local;
  
  buffer._528_8_ = args.field_1;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  format_str_00.size_ = args.desc_;
  format_str_00.data_ = (char *)format_str.size_;
  args_00.field_1.args_ = in_R8.args_;
  args_00.desc_._0_1_ = buffer.store_[0x1f0];
  args_00.desc_._1_1_ = buffer.store_[0x1f1];
  args_00.desc_._2_1_ = buffer.store_[0x1f2];
  args_00.desc_._3_1_ = buffer.store_[499];
  args_00.desc_._4_1_ = buffer.alloc_;
  args_00.desc_._5_3_ = buffer._533_3_;
  vformat_to<char>((buffer<char> *)local_248,format_str_00,args_00);
  to_string<char,500ul>
            ((v6 *)format_str.data_,
             (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return (v6 *)format_str.data_;
}

Assistant:

std::basic_string<Char> detail::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}